

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMove5<(moira::Instr)71,(moira::Mode)3,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)5,_2> dst;
  Ea<(moira::Mode)3,_2> src;
  u32 local_48;
  ushort local_44;
  u32 local_40;
  u32 local_34;
  ushort local_30;
  
  local_30 = op & 7;
  local_48 = *addr;
  local_44 = op >> 9 & 7;
  local_34 = local_48;
  local_40 = dasmIncRead<2>(this,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)3,_2> *)&local_34);
  StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)5,_2> *)&local_48);
  return;
}

Assistant:

void
Moira::dasmMove5(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <Mode::DI,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}